

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O1

double erlang_cdf(double x,double a,double b,int c)

{
  double dVar1;
  
  if (x < a) {
    return 0.0;
  }
  dVar1 = r8_gamma_inc((double)c,(x - a) / b);
  return dVar1;
}

Assistant:

double erlang_cdf ( double x, double a, double b, int c )

//****************************************************************************80
//
//  Purpose:
//
//    ERLANG_CDF evaluates the Erlang CDF.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    15 October 2004
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, double X, the argument of the CDF.
//
//    Input, double A, B, int C, the parameters of the PDF.
//    0.0 < B.
//    0 < C.
//
//    Output, double ERLANG_CDF, the value of the CDF.
//
{
  double cdf;
  double p2;
  double x2;

  if ( x < a )
  {
    cdf = 0.0;
  }
  else
  {
    x2 = ( x - a ) / b;
    p2 = static_cast<double>(c );

    cdf = r8_gamma_inc ( p2, x2 );
  }

  return cdf;
}